

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizes
          (MapFieldGenerator *this,Printer *printer,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  Type TVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  char *pcVar6;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string utf8_check;
  undefined1 local_88 [5];
  bool string_value;
  bool string_key;
  FieldDescriptor *local_68;
  FieldDescriptor *value_field;
  allocator local_49;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *key_field;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  key_field = (FieldDescriptor *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,variables,"if (!this->$name$().empty()) {\n");
  io::Printer::Indent((Printer *)variables_local);
  pDVar4 = FieldDescriptor::message_type(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"key",&local_49);
  pFVar5 = Descriptor::FindFieldByName(pDVar4,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pFVar5;
  pDVar4 = FieldDescriptor::message_type(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_88,"value",(allocator *)(utf8_check.field_2._M_local_buf + 0xf));
  pFVar5 = Descriptor::FindFieldByName(pDVar4,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator((allocator<char> *)(utf8_check.field_2._M_local_buf + 0xf));
  local_68 = pFVar5;
  TVar3 = FieldDescriptor::type(local_28);
  utf8_check.field_2._M_local_buf[0xe] = TVar3 == TYPE_STRING;
  TVar3 = FieldDescriptor::type(local_68);
  utf8_check.field_2._M_local_buf[0xd] = TVar3 == TYPE_STRING;
  io::Printer::Print((Printer *)variables_local,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)key_field,
                     "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n"
                    );
  if ((utf8_check.field_2._M_local_buf[0xe] & 1U) == 0) {
    io::Printer::Print((Printer *)variables_local,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)key_field,
                       "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n"
                      );
  }
  else {
    io::Printer::Print((Printer *)variables_local,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)key_field,
                       "typedef ConstPtr SortItem;\ntypedef ::google::protobuf::internal::CompareByDerefFirst<SortItem> Less;\n"
                      );
  }
  std::__cxx11::string::string((string *)local_b0);
  if (((utf8_check.field_2._M_local_buf[0xe] & 1U) != 0) ||
     ((utf8_check.field_2._M_local_buf[0xd] & 1U) != 0)) {
    io::Printer::Print((Printer *)variables_local,
                       "struct Utf8Check {\n  static void Check(ConstPtr p) {\n");
    io::Printer::Indent((Printer *)variables_local);
    io::Printer::Indent((Printer *)variables_local);
    if ((utf8_check.field_2._M_local_buf[0xe] & 1U) != 0) {
      GenerateUtf8CheckCodeForString
                (local_28,(this->super_FieldGenerator).options_,false,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)key_field,"p->first.data(), p->first.length(),\n",(Printer *)variables_local);
    }
    if ((utf8_check.field_2._M_local_buf[0xd] & 1U) != 0) {
      GenerateUtf8CheckCodeForString
                (local_68,(this->super_FieldGenerator).options_,false,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)key_field,"p->second.data(), p->second.length(),\n",(Printer *)variables_local);
    }
    io::Printer::Outdent((Printer *)variables_local);
    io::Printer::Outdent((Printer *)variables_local);
    io::Printer::Print((Printer *)variables_local,"  }\n};\n");
    std::__cxx11::string::operator=((string *)local_b0,"Utf8Check::Check");
  }
  io::Printer::Print((Printer *)variables_local,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)key_field,
                     "\nif ($deterministic$ &&\n    this->$name$().size() > 1) {\n  ::google::protobuf::scoped_array<SortItem> items(\n      new SortItem[this->$name$().size()]);\n  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->$name$().begin();\n      it != this->$name$().end(); ++it, ++n) {\n    items[n] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[n], Less());\n"
                    );
  io::Printer::Indent((Printer *)variables_local);
  pmVar1 = variables_local;
  pFVar5 = key_field;
  bVar2 = SupportsArenas(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"for (size_type i = 0; i < n; i++)",&local_d1);
  pcVar6 = "items[i].second";
  if ((utf8_check.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar6 = "items[i]";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,pcVar6,&local_f9);
  GenerateSerializationLoop
            ((Printer *)pmVar1,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pFVar5,bVar2,(string *)local_b0,&local_d0,&local_f8,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  io::Printer::Outdent((Printer *)variables_local);
  io::Printer::Print((Printer *)variables_local,"} else {\n");
  io::Printer::Indent((Printer *)variables_local);
  pmVar1 = variables_local;
  pFVar5 = key_field;
  bVar2 = SupportsArenas(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,
             "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->$name$().begin();\n    it != this->$name$().end(); ++it)"
             ,&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"it",&local_149);
  GenerateSerializationLoop
            ((Printer *)pmVar1,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pFVar5,bVar2,(string *)local_b0,&local_120,&local_148,true);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  io::Printer::Outdent((Printer *)variables_local);
  io::Printer::Print((Printer *)variables_local,"}\n");
  io::Printer::Outdent((Printer *)variables_local);
  io::Printer::Print((Printer *)variables_local,"}\n");
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizes(
    io::Printer* printer, const std::map<string, string>& variables) const {
  printer->Print(variables,
      "if (!this->$name$().empty()) {\n");
  printer->Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  printer->Print(variables,
      "typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    printer->Print(variables,
        "typedef ConstPtr SortItem;\n"
        "typedef ::google::protobuf::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    printer->Print(variables,
        "typedef ::google::protobuf::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::google::protobuf::internal::CompareByFirstField<SortItem> Less;\n");
  }
  string utf8_check;
  if (string_key || string_value) {
    printer->Print(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n");
    printer->Indent();
    printer->Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(key_field, options_, false, variables,
                                     "p->first.data(), p->first.length(),\n",
                                     printer);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(value_field, options_, false, variables,
                                     "p->second.data(), p->second.length(),\n",
                                     printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "};\n");
    utf8_check = "Utf8Check::Check";
  }

  printer->Print(variables,
      "\n"
      "if ($deterministic$ &&\n"
      "    this->$name$().size() > 1) {\n"
      "  ::google::protobuf::scoped_array<SortItem> items(\n"
      "      new SortItem[this->$name$().size()]);\n"
      "  typedef ::google::protobuf::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n"
      "  size_type n = 0;\n"
      "  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->$name$().begin();\n"
      "      it != this->$name$().end(); ++it, ++n) {\n"
      "    items[n] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[n], Less());\n");
  printer->Indent();
  GenerateSerializationLoop(printer, variables, SupportsArenas(descriptor_),
                            utf8_check, "for (size_type i = 0; i < n; i++)",
                            string_key ? "items[i]" : "items[i].second", false);
  printer->Outdent();
  printer->Print(
      "} else {\n");
  printer->Indent();
  GenerateSerializationLoop(
      printer, variables, SupportsArenas(descriptor_), utf8_check,
      "for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "    it = this->$name$().begin();\n"
      "    it != this->$name$().end(); ++it)",
      "it", true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}